

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O3

bool __thiscall
SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount>::EditingIterator::Next
          (EditingIterator *this)

{
  SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *pSVar1;
  SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *pSVar2;
  code *pcVar3;
  Type TVar4;
  bool bVar5;
  SListNodeBase<Memory::Recycler> *in_RAX;
  undefined4 *puVar6;
  SListNodeBase<Memory::Recycler> *pSVar7;
  Type local_38;
  
  if (this->last == (NodeBase *)0x0) {
    pSVar7 = (this->super_Iterator).current;
    local_38.ptr = in_RAX;
  }
  else {
    pSVar7 = (this->last->next).ptr;
    Memory::Recycler::WBSetBit((char *)&local_38);
    local_38.ptr = pSVar7;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
    pSVar7 = (this->super_Iterator).current;
    if (local_38.ptr != pSVar7) {
      pSVar7 = this->last;
      (this->super_Iterator).current = pSVar7;
      goto LAB_00966aed;
    }
  }
  this->last = pSVar7;
LAB_00966aed:
  if (pSVar7 == (SListNodeBase<Memory::Recycler> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
    pSVar7 = (this->super_Iterator).current;
  }
  pSVar1 = (this->super_Iterator).list;
  pSVar2 = (SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)(pSVar7->next).ptr;
  Memory::Recycler::WBSetBit((char *)&local_38);
  local_38.ptr = (SListNodeBase<Memory::Recycler> *)pSVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
  TVar4.ptr = local_38.ptr;
  if ((SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)local_38.ptr == pSVar1) {
    local_38.ptr = (SListNodeBase<Memory::Recycler> *)0x0;
  }
  else {
    pSVar7 = (((this->super_Iterator).current)->next).ptr;
    Memory::Recycler::WBSetBit((char *)&local_38);
    local_38.ptr = pSVar7;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
  }
  (this->super_Iterator).current = local_38.ptr;
  return (SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)TVar4.ptr != pSVar1;
}

Assistant:

bool Next()
        {
            if (last != nullptr && last->Next() != this->current)
            {
                this->current = last;
            }
            else
            {
                last = this->current;
            }
            return Iterator::Next();
        }